

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void Json::CharReaderBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value VStack_38;
  
  Value::Value(&VStack_38,true);
  pVVar1 = Value::operator[](settings,"collectComments");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,true);
  pVVar1 = Value::operator[](settings,"allowComments");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,true);
  pVVar1 = Value::operator[](settings,"allowTrailingCommas");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"strictRoot");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowDroppedNullPlaceholders");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowNumericKeys");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowSingleQuotes");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,1000);
  pVVar1 = Value::operator[](settings,"stackLimit");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"failIfExtra");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"rejectDupKeys");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowSpecialFloats");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,true);
  pVVar1 = Value::operator[](settings,"skipBom");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  return;
}

Assistant:

void CharReaderBuilder::setDefaults(Json::Value* settings) {
  //! [CharReaderBuilderDefaults]
  (*settings)["collectComments"] = true;
  (*settings)["allowComments"] = true;
  (*settings)["allowTrailingCommas"] = true;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = false;
  (*settings)["rejectDupKeys"] = false;
  (*settings)["allowSpecialFloats"] = false;
  (*settings)["skipBom"] = true;
  //! [CharReaderBuilderDefaults]
}